

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O2

_Bool is_rtl(wchar_t c)

{
  byte bVar1;
  
  bVar1 = bidi_getType(c);
  return (0x83f6U >> (bVar1 & 0x1f) & 1) != 0;
}

Assistant:

bool is_rtl(int c)
{
    return typeIsBidiActive(bidi_getType(c));
}